

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.cc
# Opt level: O1

void __thiscall vp9_parser::Vp9HeaderParser::ParseTileInfo(Vp9HeaderParser *this)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  sbyte sVar6;
  int iVar7;
  int iVar8;
  size_t off;
  size_t sVar9;
  
  VpxReadLiteral(this,2);
  VpxReadLiteral(this,6);
  VpxReadLiteral(this,3);
  uVar2 = this->bit_offset_;
  if ((uVar2 >> 3 < this->frame_size_) &&
     (bVar1 = this->frame_[uVar2 >> 3], this->bit_offset_ = uVar2 + 1,
     (bVar1 >> (~(byte)uVar2 & 7) & 1) != 0)) {
    uVar2 = this->bit_offset_;
    if ((uVar2 >> 3 < this->frame_size_) &&
       (bVar1 = this->frame_[uVar2 >> 3], this->bit_offset_ = uVar2 + 1,
       (bVar1 >> (~(byte)uVar2 & 7) & 1) != 0)) {
      iVar8 = 4;
      do {
        uVar2 = this->bit_offset_;
        if ((uVar2 >> 3 < this->frame_size_) &&
           (bVar1 = this->frame_[uVar2 >> 3], this->bit_offset_ = uVar2 + 1,
           (bVar1 >> (~(byte)uVar2 & 7) & 1) != 0)) {
          VpxReadLiteral(this,7);
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      iVar8 = 1;
      do {
        uVar2 = this->bit_offset_;
        if ((uVar2 >> 3 < this->frame_size_) &&
           (bVar1 = this->frame_[uVar2 >> 3], this->bit_offset_ = uVar2 + 1,
           (bVar1 >> (~(byte)uVar2 & 7) & 1) != 0)) {
          VpxReadLiteral(this,7);
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 == 0);
    }
  }
  VpxReadLiteral(this,8);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  SkipDeltaQ(this);
  uVar2 = this->frame_size_;
  uVar3 = this->bit_offset_;
  if ((uVar2 <= uVar3 >> 3) ||
     (bVar1 = this->frame_[uVar3 >> 3], this->bit_offset_ = uVar3 + 1,
     (bVar1 >> (~(byte)uVar3 & 7) & 1) == 0)) {
    iVar8 = (this->width_ + 7 >> 3) + 7 >> 3;
    iVar7 = -1;
    do {
      iVar7 = iVar7 + 1;
    } while (3 < iVar8 >> ((byte)iVar7 & 0x1f));
    iVar5 = 0;
    do {
      iVar4 = iVar5;
      iVar5 = iVar4 + 1;
    } while (0x40 << ((byte)iVar4 & 0x1f) < iVar8);
    iVar8 = 1;
    if (1 < iVar7) {
      iVar8 = iVar7;
    }
    iVar5 = iVar4;
    if (iVar8 != iVar4 + 1) {
      iVar8 = 1;
      if (1 < iVar7) {
        iVar8 = iVar7;
      }
      sVar9 = this->bit_offset_;
      while (iVar5 = iVar4, sVar9 >> 3 < uVar2) {
        bVar1 = this->frame_[sVar9 >> 3];
        this->bit_offset_ = sVar9 + 1;
        if (((bVar1 >> (~(byte)sVar9 & 7) & 1) == 0) ||
           (iVar7 = iVar4 - iVar8, iVar4 = iVar4 + 1, sVar9 = sVar9 + 1, iVar5 = iVar8 + -1,
           iVar7 == -2)) break;
      }
    }
    uVar3 = this->bit_offset_;
    sVar6 = 0;
    if ((uVar3 >> 3 < uVar2) &&
       (bVar1 = this->frame_[uVar3 >> 3], this->bit_offset_ = uVar3 + 1, sVar6 = 0,
       (bVar1 >> (~(byte)uVar3 & 7) & 1) != 0)) {
      uVar3 = this->bit_offset_;
      sVar6 = 1;
      if (uVar3 >> 3 < uVar2) {
        bVar1 = this->frame_[uVar3 >> 3];
        this->bit_offset_ = uVar3 + 1;
        sVar6 = ((bVar1 >> (~(uint)uVar3 & 7) & 1) != 0) + 1;
      }
    }
    this->row_tiles_ = 1 << sVar6;
    this->column_tiles_ = 1 << ((byte)iVar5 & 0x1f);
  }
  return;
}

Assistant:

void Vp9HeaderParser::ParseTileInfo() {
  VpxReadLiteral(2);  // Consume frame context index

  // loopfilter
  VpxReadLiteral(6);  // Consume filter level
  VpxReadLiteral(3);  // Consume sharpness level

  const bool mode_ref_delta_enabled = ReadBit();
  if (mode_ref_delta_enabled) {
    const bool mode_ref_delta_update = ReadBit();
    if (mode_ref_delta_update) {
      const int kMaxRefLFDeltas = 4;
      for (int i = 0; i < kMaxRefLFDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume ref_deltas + sign
      }

      const int kMaxModeDeltas = 2;
      for (int i = 0; i < kMaxModeDeltas; ++i) {
        if (ReadBit())
          VpxReadLiteral(7);  // Consume mode_delta + sign
      }
    }
  }

  // quantization
  VpxReadLiteral(8);  // Consume base_q
  SkipDeltaQ();  // y dc
  SkipDeltaQ();  // uv ac
  SkipDeltaQ();  // uv dc

  // segmentation
  const bool segmentation_enabled = ReadBit();
  if (!segmentation_enabled) {
    const int aligned_width = AlignPowerOfTwo(width_, kMiSizeLog2);
    const int mi_cols = aligned_width >> kMiSizeLog2;
    const int aligned_mi_cols = AlignPowerOfTwo(mi_cols, kMiSizeLog2);
    const int sb_cols = aligned_mi_cols >> 3;  // to_sbs(mi_cols);
    int min_log2_n_tiles, max_log2_n_tiles;

    for (max_log2_n_tiles = 0;
         (sb_cols >> max_log2_n_tiles) >= kMinTileWidthB64;
         max_log2_n_tiles++) {
    }
    max_log2_n_tiles--;
    if (max_log2_n_tiles < 0)
      max_log2_n_tiles = 0;

    for (min_log2_n_tiles = 0; (kMaxTileWidthB64 << min_log2_n_tiles) < sb_cols;
         min_log2_n_tiles++) {
    }

    // columns
    const int max_log2_tile_cols = max_log2_n_tiles;
    const int min_log2_tile_cols = min_log2_n_tiles;
    int max_ones = max_log2_tile_cols - min_log2_tile_cols;
    int log2_tile_cols = min_log2_tile_cols;
    while (max_ones-- && ReadBit())
      log2_tile_cols++;

    // rows
    int log2_tile_rows = ReadBit();
    if (log2_tile_rows)
      log2_tile_rows += ReadBit();

    row_tiles_ = 1 << log2_tile_rows;
    column_tiles_ = 1 << log2_tile_cols;
  }
}